

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compress_symbolic.cpp
# Opt level: O0

void compress_block(astcenc_contexti *ctx,image_block *blk,uint8_t *pcb,
                   compression_working_buffers *tmpbuf)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  block_mode *this;
  symbolic_compressed_block *in_RCX;
  long in_RSI;
  int *in_RDI;
  float fVar10;
  float fVar11;
  float fVar12;
  vint4 color_u16_1;
  vfloat4 color_f32_1;
  float best_error_scale;
  float best_error;
  float best_error_scale_1;
  float best_error_1;
  float errorval_2;
  uint i_2;
  float best_error_in_prev;
  uint actual_trials;
  uint requested_trials;
  uint requested_indices;
  uint partition_indices [8];
  int partition_count;
  float errorval_1;
  int i_1;
  block_mode *bm;
  float errorval;
  int i;
  int quant_limit;
  int start_trial;
  float errorval_overshoot;
  float errorval_mult [2];
  float exit_thresholds_for_pcount [4];
  float best_errorvals_for_pcount [4];
  float error_threshold;
  float error_weight_sum;
  vint4 color_u16;
  vfloat4 color_f32;
  vint4 color_f16;
  uint requested_partition_trials [3];
  uint requested_partition_indices [3];
  int max_partitions;
  bool block_skip_two_plane;
  float block_is_la_scale;
  bool block_is_la;
  float block_is_l_scale;
  bool block_is_l;
  float lowest_correl;
  block_size_descriptor *bsd;
  symbolic_compressed_block scb;
  astcenc_profile decode_mode;
  uint in_stack_00000464;
  uint *in_stack_00000468;
  uint in_stack_00000470;
  uint in_stack_00000474;
  image_block *in_stack_00000478;
  block_size_descriptor *in_stack_00000480;
  symbolic_compressed_block *in_stack_fffffffffffff188;
  undefined4 in_stack_fffffffffffff190;
  uint in_stack_fffffffffffff194;
  int in_stack_fffffffffffff198;
  undefined4 in_stack_fffffffffffff19c;
  float local_e4c;
  float local_e44;
  image_block *in_stack_fffffffffffff208;
  undefined8 in_stack_fffffffffffff210;
  uint local_dc4;
  int local_d84;
  int local_d7c;
  int local_d68;
  quant_method local_d64;
  int local_d60;
  float local_d58 [3];
  int local_d4c;
  undefined4 in_stack_fffffffffffff2b8;
  undefined4 in_stack_fffffffffffff2bc;
  undefined4 uVar13;
  symbolic_compressed_block *in_stack_fffffffffffff2c0;
  symbolic_compressed_block *scb_00;
  block_size_descriptor *in_stack_fffffffffffff2c8;
  block_size_descriptor *bsd_00;
  uint local_c3c [4];
  int local_c2c;
  int local_c28;
  int local_c24;
  bool local_c1d;
  float local_c1c;
  undefined1 local_c15;
  float local_c14;
  undefined1 local_c0d;
  float local_c0c;
  long local_c08;
  char local_c00;
  undefined1 local_bff;
  undefined4 local_bf0;
  undefined8 local_bec;
  undefined8 uStack_be4;
  int local_b74;
  symbolic_compressed_block *local_b70;
  long local_b60;
  int *local_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 *local_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 *local_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 *local_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined1 local_a60 [16];
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined4 local_a34;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined1 local_a10 [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined4 local_9e4;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined4 local_998;
  undefined4 local_994;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined4 local_948;
  undefined4 local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_920 [16];
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8d0 [16];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  ulong local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  ulong local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined1 local_810 [16];
  undefined1 *local_7f8;
  ulong local_7f0;
  undefined8 uStack_7e8;
  int local_7e0;
  int iStack_7dc;
  int iStack_7d8;
  int iStack_7d4;
  uint in_stack_fffffffffffff830;
  uint in_stack_fffffffffffff834;
  undefined8 in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  undefined4 in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff84c;
  astcenc_config *in_stack_fffffffffffff850;
  undefined1 local_6a0 [20];
  undefined4 local_68c;
  undefined1 *local_688;
  undefined4 local_67c;
  undefined1 *local_678;
  undefined4 local_66c;
  undefined1 *local_668;
  undefined4 local_65c;
  undefined1 *local_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 *local_5f8;
  float local_5f0;
  float fStack_5ec;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  symbolic_compressed_block *in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  astcenc_config *in_stack_fffffffffffffa40;
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined4 local_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined4 local_4fc;
  undefined1 *local_4f8;
  undefined4 local_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined4 local_4d4;
  undefined1 local_4d0 [16];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined4 local_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined4 local_47c;
  undefined1 *local_478;
  undefined4 local_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined4 local_454;
  undefined1 local_450 [16];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined4 local_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined4 local_3fc;
  undefined1 *local_3f8;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined4 local_3d4;
  undefined1 local_3d0 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined4 local_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined4 local_37c;
  undefined1 *local_378;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined4 local_354;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined1 local_170 [16];
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  undefined1 *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  undefined1 local_40 [16];
  
  local_b74 = *in_RDI;
  local_c08 = *(long *)(in_RDI + 0x20);
  local_b70 = in_RCX;
  local_b60 = in_RSI;
  local_b58 = in_RDI;
  local_c0d = image_block::is_luminance
                        ((image_block *)
                         CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  local_e44 = 0.6666667;
  if (!(bool)local_c0d) {
    local_e44 = 1.0;
  }
  local_c14 = local_e44;
  local_c15 = image_block::is_luminancealpha
                        ((image_block *)
                         CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  local_e4c = 0.952381;
  if (!(bool)local_c15) {
    local_e4c = 1.0;
  }
  local_c1c = local_e4c;
  local_c1d = false;
  local_c24 = local_b58[0xb];
  local_c3c[3] = local_b58[0xc];
  local_c2c = local_b58[0xd];
  local_c28 = local_b58[0xe];
  local_c3c[0] = local_b58[0x12];
  local_c3c[1] = local_b58[0x13];
  local_c3c[2] = local_b58[0x14];
  local_b20 = *(undefined8 *)*(undefined1 (*) [16])(local_b60 + 0xe10);
  uStack_b18 = *(undefined8 *)(local_b60 + 0xe18);
  local_b30 = *(undefined8 *)*(undefined1 (*) [16])(local_b60 + 0xe30);
  uStack_b28 = *(undefined8 *)(local_b60 + 0xe38);
  local_810 = vcmpps_avx(*(undefined1 (*) [16])(local_b60 + 0xe10),
                         *(undefined1 (*) [16])(local_b60 + 0xe30),0);
  local_7f8 = local_b10;
  local_b40 = local_810._0_8_;
  uStack_b38 = local_810._8_8_;
  local_b50 = local_810._0_8_;
  uStack_b48 = local_810._8_8_;
  local_850 = local_810._0_8_;
  uStack_848 = local_810._8_8_;
  local_840 = local_810._0_8_;
  uStack_838 = local_810._8_8_;
  iVar8 = vmovmskps_avx(local_810);
  local_830 = local_b30;
  uStack_828 = uStack_b28;
  local_820 = local_b20;
  uStack_818 = uStack_b18;
  if (iVar8 == 0xf) {
    local_bff = 0;
    if ((local_b74 == 3) || (local_b74 == 2)) {
      local_c00 = 1;
      local_ae0 = *(undefined8 *)*(undefined1 (*) [16])(local_b60 + 0xe00);
      uStack_ad8 = *(undefined8 *)(local_b60 + 0xe08);
      local_af0 = vcvtps2ph_f16c(*(undefined1 (*) [16])(local_b60 + 0xe00),0);
      local_7f0 = local_af0._0_8_;
      uStack_7e8 = local_af0._8_8_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_af0._0_8_;
      local_b00 = vpmovzxwd_avx(auVar2);
      local_a78 = &local_bec;
      local_a70 = local_b00._0_8_;
      uStack_a68 = local_b00._8_8_;
      local_bec = local_b00._0_8_;
      uStack_be4 = local_b00._8_8_;
    }
    else {
      local_c00 = 2;
      local_970 = *(undefined8 *)*(undefined1 (*) [16])(local_b60 + 0xe00);
      uStack_968 = *(undefined8 *)(local_b60 + 0xe08);
      local_944 = 0;
      local_948 = 0x3f800000;
      local_424 = 0;
      local_3f8 = local_450;
      local_3fc = 0;
      local_3d4 = 0;
      local_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      uStack_3e4 = 0;
      local_220 = 0;
      uStack_218 = 0;
      local_1d0 = 0;
      uStack_1c8 = 0;
      local_1f0 = vmaxps_avx(*(undefined1 (*) [16])(local_b60 + 0xe00),ZEXT816(0));
      local_1d8 = local_200;
      local_410 = local_1f0._0_8_;
      uStack_408 = local_1f0._8_8_;
      local_960 = local_1f0._0_8_;
      uStack_958 = local_1f0._8_8_;
      local_520 = local_1f0._0_8_;
      uStack_518 = local_1f0._8_8_;
      local_524 = 0x3f800000;
      local_540 = local_1f0._0_8_;
      uStack_538 = local_1f0._8_8_;
      local_4f8 = local_550;
      local_4fc = 0x3f800000;
      local_4d4 = 0x3f800000;
      local_4f0 = 0x3f800000;
      uStack_4ec = 0x3f800000;
      uStack_4e8 = 0x3f800000;
      uStack_4e4 = 0x3f800000;
      local_300 = 0x3f8000003f800000;
      uStack_2f8 = 0x3f8000003f800000;
      local_2f0 = local_1f0._0_8_;
      uStack_2e8 = local_1f0._8_8_;
      local_2a0 = local_1f0._0_8_;
      uStack_298 = local_1f0._8_8_;
      auVar3._8_8_ = 0x3f8000003f800000;
      auVar3._0_8_ = 0x3f8000003f800000;
      local_2d0 = vminps_avx(local_1f0,auVar3);
      local_2b8 = local_2e0;
      local_510 = local_2d0._0_8_;
      uStack_508 = local_2d0._8_8_;
      local_930 = local_2d0._0_8_;
      uStack_928 = local_2d0._8_8_;
      local_9e0 = local_2d0._0_8_;
      uStack_9d8 = local_2d0._8_8_;
      local_9e4 = 0x477fff00;
      local_a00 = local_2d0._0_8_;
      uStack_9f8 = local_2d0._8_8_;
      local_668 = local_a10;
      local_66c = 0x477fff00;
      local_620 = local_2d0._0_8_;
      uVar5 = local_620;
      uStack_618 = local_2d0._8_8_;
      uVar6 = uStack_618;
      local_630 = 0x477fff00477fff00;
      uStack_628 = 0x477fff00477fff00;
      local_620._0_4_ = local_2d0._0_4_;
      local_620._4_4_ = local_2d0._4_4_;
      uStack_618._0_4_ = local_2d0._8_4_;
      uStack_618._4_4_ = local_2d0._12_4_;
      local_5f0 = (float)local_620 * 65535.0;
      fStack_5ec = local_620._4_4_ * 65535.0;
      local_9d0 = CONCAT44(fStack_5ec,local_5f0);
      uStack_9c8 = CONCAT44(uStack_618._4_4_ * 65535.0,(float)uStack_618 * 65535.0);
      local_688 = local_8d0;
      local_68c = 0x3f000000;
      local_190 = 0x3f0000003f000000;
      uStack_188 = 0x3f0000003f000000;
      local_b0 = 0x3f0000003f000000;
      uStack_a8 = 0x3f0000003f000000;
      local_160 = local_5f0 + 0.5;
      fStack_15c = fStack_5ec + 0.5;
      fStack_158 = (float)uStack_618 * 65535.0 + 0.5;
      fStack_154 = uStack_618._4_4_ * 65535.0 + 0.5;
      local_148 = local_170;
      local_8b0 = CONCAT44(fStack_15c,local_160);
      uStack_8a8 = CONCAT44(fStack_154,fStack_158);
      local_7e0 = (int)local_160;
      iStack_7dc = (int)fStack_15c;
      iStack_7d8 = (int)fStack_158;
      iStack_7d4 = (int)fStack_154;
      local_a90 = CONCAT44(iStack_7dc,local_7e0);
      uStack_a88 = CONCAT44(iStack_7d4,iStack_7d8);
      local_a98 = &local_bec;
      local_940 = local_970;
      uStack_938 = uStack_968;
      local_8c0 = local_9d0;
      uStack_8b8 = uStack_9c8;
      local_8a0 = local_8b0;
      uStack_898 = uStack_8a8;
      local_620 = uVar5;
      uStack_618 = uVar6;
      local_440 = local_970;
      uStack_438 = uStack_968;
      local_420 = local_970;
      uStack_418 = uStack_968;
      local_2b0 = local_300;
      uStack_2a8 = uStack_2f8;
      local_210 = local_970;
      uStack_208 = uStack_968;
      local_1c0 = local_970;
      uStack_1b8 = uStack_968;
      local_180 = local_9d0;
      uStack_178 = uStack_9c8;
      local_f0 = local_8b0;
      uStack_e8 = uStack_8a8;
      local_a0 = local_9d0;
      uStack_98 = uStack_9c8;
      local_bec = local_a90;
      uStack_be4 = uStack_a88;
    }
    symbolic_to_physical
              (in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
               (uint8_t *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
  }
  else {
    pauVar1 = (undefined1 (*) [16])(local_b60 + 0xe40);
    local_870 = *(undefined8 *)*pauVar1;
    uStack_868 = *(undefined8 *)(local_b60 + 0xe48);
    local_90 = vunpckhpd_avx(*pauVar1,*pauVar1);
    local_80._0_4_ = (float)local_870;
    local_80._4_4_ = (float)((ulong)local_870 >> 0x20);
    local_50 = local_80._4_4_ + (float)local_90._4_4_;
    local_40._0_4_ = (float)local_80 + (float)local_90._0_4_ + local_50;
    local_40._4_4_ = 0;
    local_880 = local_40._0_8_;
    uStack_878 = 0;
    local_860 = local_40._0_8_;
    uStack_858 = 0;
    local_e4c = (float)local_b58[0x15] * (float)local_40._0_4_ * (float)*(byte *)(local_c08 + 3) *
                local_c14 * local_e4c;
    local_bf0 = 0x7149f2ca;
    local_c00 = '\0';
    scb_00 = (symbolic_compressed_block *)0x7149f2ca7149f2ca;
    bsd_00 = (block_size_descriptor *)0x7149f2ca7149f2ca;
    local_d58[2] = 0.0;
    local_d4c = local_b58[0x17];
    iVar8 = local_b58[0x18];
    uVar13 = 0;
    local_d58[0] = 1.0 / (float)local_b58[0x16];
    local_d58[1] = 1.0;
    local_d60 = 1;
    if ((0.85 <= (float)local_b58[0x1a]) && (*(char *)(local_c08 + 2) == '\x01')) {
      local_d60 = 0;
    }
    local_d64 = QUANT_32;
    local_80 = local_870;
    uStack_78 = uStack_868;
    local_70 = local_870;
    uStack_68 = uStack_868;
    local_60 = local_870;
    uStack_58 = uStack_868;
    fStack_4c = local_50;
    fStack_48 = local_50;
    fStack_44 = local_50;
    local_40 = ZEXT416((uint)local_40._0_4_);
    for (local_d68 = local_d60; local_d68 < 2; local_d68 = local_d68 + 1) {
      in_stack_fffffffffffff190 = 0xb;
      in_stack_fffffffffffff188 = local_b70;
      fVar10 = compress_symbolic_block_for_partition_1plane
                         (in_stack_fffffffffffff850,
                          (block_size_descriptor *)
                          CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                          (image_block *)
                          CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                          SUB81((ulong)in_stack_fffffffffffff838 >> 0x38,0),
                          (float)in_stack_fffffffffffff838,in_stack_fffffffffffff834,
                          in_stack_fffffffffffff830,local_b70,
                          (compression_working_buffers *)CONCAT44(in_stack_fffffffffffff194,0xb),
                          in_stack_fffffffffffff198);
      this = block_size_descriptor::get_block_mode
                       ((block_size_descriptor *)
                        CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                        in_stack_fffffffffffff194);
      local_d64 = block_mode::get_weight_quant_mode(this);
      fVar11 = astc::min<float>(SUB84(scb_00,0),fVar10);
      scb_00 = (symbolic_compressed_block *)CONCAT44((int)((ulong)scb_00 >> 0x20),fVar11);
      if (fVar10 < local_e4c * local_d58[local_d68]) goto LAB_0056e0e4;
    }
    local_c0c = prepare_block_statistics
                          ((int)((ulong)in_stack_fffffffffffff210 >> 0x20),in_stack_fffffffffffff208
                          );
    local_c1d = (float)local_b58[0x19] < local_c0c;
    for (local_d7c = 3; -1 < local_d7c; local_d7c = local_d7c + -1) {
      if (((local_c1d & 1U) == 0) &&
         ((((*(byte *)(local_b60 + 0xe50) & 1) == 0 || (local_d7c == 3)) &&
          (bVar7 = image_block::is_constant_channel
                             ((image_block *)
                              CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                              (int)((ulong)in_stack_fffffffffffff188 >> 0x20)), !bVar7)))) {
        fVar10 = compress_symbolic_block_for_partition_2planes
                           (in_stack_fffffffffffffa40,
                            (block_size_descriptor *)
                            CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                            (image_block *)
                            CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                            (float)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                            (uint)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                            (compression_working_buffers *)
                            CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                            (int)in_stack_fffffffffffff188);
        if (SUB84(scb_00,0) * 1.85 < fVar10) break;
        if (fVar10 < local_e4c) goto LAB_0056e0e4;
      }
    }
    for (local_d84 = 2; local_d84 <= local_c24; local_d84 = local_d84 + 1) {
      astc::min<unsigned_int>(local_c3c[local_d84 + -2],local_c3c[(long)(local_d84 + -2) + 3]);
      uVar9 = find_best_partition_candidates
                        (in_stack_00000480,in_stack_00000478,in_stack_00000474,in_stack_00000470,
                         in_stack_00000468,in_stack_00000464);
      fVar10 = *(float *)(&stack0xfffffffffffff2c0 + (long)(local_d84 + -2) * 4);
      for (local_dc4 = 0; local_dc4 < uVar9; local_dc4 = local_dc4 + 1) {
        fVar11 = compress_symbolic_block_for_partition_1plane
                           (in_stack_fffffffffffff850,
                            (block_size_descriptor *)
                            CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                            (image_block *)
                            CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                            SUB81((ulong)in_stack_fffffffffffff838 >> 0x38,0),
                            (float)in_stack_fffffffffffff838,in_stack_fffffffffffff834,
                            in_stack_fffffffffffff830,local_b70,
                            (compression_working_buffers *)
                            CONCAT44(in_stack_fffffffffffff194,local_d64),in_stack_fffffffffffff198)
        ;
        fVar12 = astc::min<float>(*(float *)(&stack0xfffffffffffff2c0 + (long)(local_d84 + -1) * 4),
                                  fVar11);
        *(float *)(&stack0xfffffffffffff2c0 + (long)(local_d84 + -1) * 4) = fVar12;
        if ((fVar10 * local_d58[(long)(local_d84 + -1) + 2] * 1.85 <
             *(float *)(&stack0xfffffffffffff2c0 + (long)(local_d84 + -1) * 4)) ||
           (fVar11 < local_e4c)) goto LAB_0056e0e4;
      }
      if (fVar10 * local_d58[(long)(local_d84 + -1) + 2] <
          *(float *)(&stack0xfffffffffffff2c0 + (long)(local_d84 + -1) * 4)) break;
    }
LAB_0056e0e4:
    if (local_c00 == '\0') {
      local_c00 = '\x02';
      local_9c0 = *(undefined8 *)*(undefined1 (*) [16])(local_b60 + 0xe00);
      uStack_9b8 = *(undefined8 *)(local_b60 + 0xe08);
      local_994 = 0;
      local_998 = 0x3f800000;
      local_3a4 = 0;
      local_378 = local_3d0;
      local_37c = 0;
      local_354 = 0;
      local_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = 0;
      local_270 = 0;
      uStack_268 = 0;
      local_1b0 = 0;
      uStack_1a8 = 0;
      local_240 = vmaxps_avx(*(undefined1 (*) [16])(local_b60 + 0xe00),ZEXT816(0));
      local_228 = local_250;
      local_390 = local_240._0_8_;
      uStack_388 = local_240._8_8_;
      local_9b0 = local_240._0_8_;
      uStack_9a8 = local_240._8_8_;
      local_4a0 = local_240._0_8_;
      uStack_498 = local_240._8_8_;
      local_4a4 = 0x3f800000;
      local_4c0 = local_240._0_8_;
      uStack_4b8 = local_240._8_8_;
      local_478 = local_4d0;
      local_47c = 0x3f800000;
      local_454 = 0x3f800000;
      local_470 = 0x3f800000;
      uStack_46c = 0x3f800000;
      uStack_468 = 0x3f800000;
      uStack_464 = 0x3f800000;
      local_350 = 0x3f8000003f800000;
      uStack_348 = 0x3f8000003f800000;
      local_340 = local_240._0_8_;
      uStack_338 = local_240._8_8_;
      local_280 = local_240._0_8_;
      uStack_278 = local_240._8_8_;
      auVar4._8_8_ = 0x3f8000003f800000;
      auVar4._0_8_ = 0x3f8000003f800000;
      local_320 = vminps_avx(local_240,auVar4);
      local_308 = local_330;
      local_490 = local_320._0_8_;
      uStack_488 = local_320._8_8_;
      local_980 = local_320._0_8_;
      uStack_978 = local_320._8_8_;
      local_a30 = local_320._0_8_;
      uStack_a28 = local_320._8_8_;
      local_a34 = 0x477fff00;
      local_a50 = local_320._0_8_;
      uStack_a48 = local_320._8_8_;
      local_658 = local_a60;
      local_65c = 0x477fff00;
      local_640 = local_320._0_8_;
      uVar5 = local_640;
      uStack_638 = local_320._8_8_;
      uVar6 = uStack_638;
      local_650 = 0x477fff00477fff00;
      uStack_648 = 0x477fff00477fff00;
      local_640._0_4_ = local_320._0_4_;
      local_640._4_4_ = local_320._4_4_;
      uStack_638._0_4_ = local_320._8_4_;
      uStack_638._4_4_ = local_320._12_4_;
      local_610 = (float)local_640 * 65535.0;
      fStack_60c = local_640._4_4_ * 65535.0;
      fStack_608 = (float)uStack_638 * 65535.0;
      fStack_604 = uStack_638._4_4_ * 65535.0;
      local_5f8 = local_6a0;
      local_a20 = CONCAT44(fStack_60c,local_610);
      uStack_a18 = CONCAT44(fStack_604,fStack_608);
      local_678 = local_920;
      local_67c = 0x3f000000;
      local_140 = 0x3f0000003f000000;
      uStack_138 = 0x3f0000003f000000;
      local_d0 = 0x3f0000003f000000;
      uStack_c8 = 0x3f0000003f000000;
      local_110 = local_610 + 0.5;
      fStack_10c = fStack_60c + 0.5;
      fStack_108 = fStack_608 + 0.5;
      fStack_104 = fStack_604 + 0.5;
      local_f8 = local_120;
      local_900 = CONCAT44(fStack_10c,local_110);
      uStack_8f8 = CONCAT44(fStack_104,fStack_108);
      local_ab0 = CONCAT44((int)fStack_10c,(int)local_110);
      uStack_aa8 = CONCAT44((int)fStack_104,(int)fStack_108);
      local_ab8 = &local_bec;
      local_990 = local_9c0;
      uStack_988 = uStack_9b8;
      local_910 = local_a20;
      uStack_908 = uStack_a18;
      local_8f0 = local_900;
      uStack_8e8 = uStack_8f8;
      local_640 = uVar5;
      uStack_638 = uVar6;
      local_3c0 = local_9c0;
      uStack_3b8 = uStack_9b8;
      local_3a0 = local_9c0;
      uStack_398 = uStack_9b8;
      local_290 = local_350;
      uStack_288 = uStack_348;
      local_260 = local_9c0;
      uStack_258 = uStack_9b8;
      local_1a0 = local_9c0;
      uStack_198 = uStack_9b8;
      local_130 = local_a20;
      uStack_128 = uStack_a18;
      local_e0 = local_900;
      uStack_d8 = uStack_8f8;
      local_c0 = local_a20;
      uStack_b8 = uStack_a18;
      local_bec = local_ab0;
      uStack_be4 = uStack_aa8;
    }
    symbolic_to_physical(bsd_00,scb_00,(uint8_t *)CONCAT44(uVar13,iVar8));
  }
  return;
}

Assistant:

void compress_block(
	const astcenc_contexti& ctx,
	const image_block& blk,
	uint8_t pcb[16],
	compression_working_buffers& tmpbuf)
{
	astcenc_profile decode_mode = ctx.config.profile;
	symbolic_compressed_block scb;
	const block_size_descriptor& bsd = *ctx.bsd;
	float lowest_correl;

	TRACE_NODE(node0, "block");
	trace_add_data("pos_x", blk.xpos);
	trace_add_data("pos_y", blk.ypos);
	trace_add_data("pos_z", blk.zpos);

	// Set stricter block targets for luminance data as we have more bits to play with
	bool block_is_l = blk.is_luminance();
	float block_is_l_scale = block_is_l ? 1.0f / 1.5f : 1.0f;

	// Set slightly stricter block targets for lumalpha data as we have more bits to play with
	bool block_is_la = blk.is_luminancealpha();
	float block_is_la_scale = block_is_la ? 1.0f / 1.05f : 1.0f;

	bool block_skip_two_plane = false;
	int max_partitions = ctx.config.tune_partition_count_limit;

	unsigned int requested_partition_indices[3] {
		ctx.config.tune_2partition_index_limit,
		ctx.config.tune_3partition_index_limit,
		ctx.config.tune_4partition_index_limit
	};

	unsigned int requested_partition_trials[3] {
		ctx.config.tune_2partitioning_candidate_limit,
		ctx.config.tune_3partitioning_candidate_limit,
		ctx.config.tune_4partitioning_candidate_limit
	};

#if defined(ASTCENC_DIAGNOSTICS)
	// Do this early in diagnostic builds so we can dump uniform metrics
	// for every block. Do it later in release builds to avoid redundant work!
	float error_weight_sum = hadd_s(blk.channel_weight) * bsd.texel_count;
	float error_threshold = ctx.config.tune_db_limit
	                      * error_weight_sum
	                      * block_is_l_scale
	                      * block_is_la_scale;

	lowest_correl = prepare_block_statistics(bsd.texel_count, blk);
	trace_add_data("lowest_correl", lowest_correl);
	trace_add_data("tune_error_threshold", error_threshold);
#endif

	// Detected a constant-color block
	if (all(blk.data_min == blk.data_max))
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 0);
		trace_add_data("plane_count", 1);

		scb.partition_count = 0;

		// Encode as FP16 if using HDR
		if ((decode_mode == ASTCENC_PRF_HDR) ||
		    (decode_mode == ASTCENC_PRF_HDR_RGB_LDR_A))
		{
			scb.block_type = SYM_BTYPE_CONST_F16;
			vint4 color_f16 = float_to_float16(blk.origin_texel);
			store(color_f16, scb.constant_color);
		}
		// Encode as UNORM16 if NOT using HDR
		else
		{
			scb.block_type = SYM_BTYPE_CONST_U16;
			vfloat4 color_f32 = clamp(0.0f, 1.0f, blk.origin_texel) * 65535.0f;
			vint4 color_u16 = float_to_int_rtn(color_f32);
			store(color_u16, scb.constant_color);
		}

		trace_add_data("exit", "quality hit");

		symbolic_to_physical(bsd, scb, pcb);
		return;
	}

#if !defined(ASTCENC_DIAGNOSTICS)
	float error_weight_sum = hadd_s(blk.channel_weight) * bsd.texel_count;
	float error_threshold = ctx.config.tune_db_limit
	                      * error_weight_sum
	                      * block_is_l_scale
	                      * block_is_la_scale;
#endif

	// Set SCB and mode errors to a very high error value
	scb.errorval = ERROR_CALC_DEFAULT;
	scb.block_type = SYM_BTYPE_ERROR;

	float best_errorvals_for_pcount[BLOCK_MAX_PARTITIONS] {
		ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT
	};

	float exit_thresholds_for_pcount[BLOCK_MAX_PARTITIONS] {
		0.0f,
		ctx.config.tune_2partition_early_out_limit_factor,
		ctx.config.tune_3partition_early_out_limit_factor,
		0.0f
	};

	// Trial using 1 plane of weights and 1 partition.

	// Most of the time we test it twice, first with a mode cutoff of 0 and then with the specified
	// mode cutoff. This causes an early-out that speeds up encoding of easy blocks. However, this
	// optimization is disabled for 4x4 and 5x4 blocks where it nearly always slows down the
	// compression and slightly reduces image quality.

	float errorval_mult[2] {
		1.0f / ctx.config.tune_mse_overshoot,
		1.0f
	};

	const float errorval_overshoot = 1.0f / ctx.config.tune_mse_overshoot;

	// Only enable MODE0 fast path if enabled
	// Never enable for 3D blocks as no "always" block modes are available
	int start_trial = 1;
 	if ((ctx.config.tune_search_mode0_enable >= TUNE_MIN_SEARCH_MODE0) && (bsd.zdim == 1))
	{
		start_trial = 0;
	}

	int quant_limit = QUANT_32;
	for (int i = start_trial; i < 2; i++)
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 1);
		trace_add_data("plane_count", 1);
		trace_add_data("search_mode", i);

		float errorval = compress_symbolic_block_for_partition_1plane(
		    ctx.config, bsd, blk, i == 0,
		    error_threshold * errorval_mult[i] * errorval_overshoot,
		    1, 0,  scb, tmpbuf, QUANT_32);

		// Record the quant level so we can use the filter later searches
		const auto& bm = bsd.get_block_mode(scb.block_mode);
		quant_limit = bm.get_weight_quant_mode();

		best_errorvals_for_pcount[0] = astc::min(best_errorvals_for_pcount[0], errorval);
		if (errorval < (error_threshold * errorval_mult[i]))
		{
			trace_add_data("exit", "quality hit");
			goto END_OF_TESTS;
		}
	}

#if !defined(ASTCENC_DIAGNOSTICS)
	lowest_correl = prepare_block_statistics(bsd.texel_count, blk);
#endif

	block_skip_two_plane = lowest_correl > ctx.config.tune_2plane_early_out_limit_correlation;

	// Test the four possible 1-partition, 2-planes modes. Do this in reverse, as
	// alpha is the most likely to be non-correlated if it is present in the data.
	for (int i = BLOCK_MAX_COMPONENTS - 1; i >= 0; i--)
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 1);
		trace_add_data("plane_count", 2);
		trace_add_data("plane_component", i);

		if (block_skip_two_plane)
		{
			trace_add_data("skip", "tune_2plane_early_out_limit_correlation");
			continue;
		}

		if (blk.grayscale && i != 3)
		{
			trace_add_data("skip", "grayscale block");
			continue;
		}

		if (blk.is_constant_channel(i))
		{
			trace_add_data("skip", "constant component");
			continue;
		}

		float errorval = compress_symbolic_block_for_partition_2planes(
		    ctx.config, bsd, blk, error_threshold * errorval_overshoot,
		    i, scb, tmpbuf, quant_limit);

		// If attempting two planes is much worse than the best one plane result
		// then further two plane searches are unlikely to help so move on ...
		if (errorval > (best_errorvals_for_pcount[0] * 1.85f))
		{
			break;
		}

		if (errorval < error_threshold)
		{
			trace_add_data("exit", "quality hit");
			goto END_OF_TESTS;
		}
	}

	// Find best blocks for 2, 3 and 4 partitions
	for (int partition_count = 2; partition_count <= max_partitions; partition_count++)
	{
		unsigned int partition_indices[TUNE_MAX_PARTITIONING_CANDIDATES];

		unsigned int requested_indices = requested_partition_indices[partition_count - 2];

		unsigned int requested_trials = requested_partition_trials[partition_count - 2];
		requested_trials = astc::min(requested_trials, requested_indices);

		unsigned int actual_trials = find_best_partition_candidates(
		    bsd, blk, partition_count, requested_indices, partition_indices, requested_trials);

		float best_error_in_prev = best_errorvals_for_pcount[partition_count - 2];

		for (unsigned int i = 0; i < actual_trials; i++)
		{
			TRACE_NODE(node1, "pass");
			trace_add_data("partition_count", partition_count);
			trace_add_data("partition_index", partition_indices[i]);
			trace_add_data("plane_count", 1);
			trace_add_data("search_mode", i);

			float errorval = compress_symbolic_block_for_partition_1plane(
			    ctx.config, bsd, blk, false,
			    error_threshold * errorval_overshoot,
			    partition_count, partition_indices[i],
			    scb, tmpbuf, quant_limit);

			best_errorvals_for_pcount[partition_count - 1] = astc::min(best_errorvals_for_pcount[partition_count - 1], errorval);

			// If using N partitions doesn't improve much over using N-1 partitions then skip trying
			// N+1. Error can dramatically improve if the data is correlated or non-correlated and
			// aligns with a partitioning that suits that encoding, so for this inner loop check add
			// a large error scale because the "other" trial could be a lot better.
			float best_error = best_errorvals_for_pcount[partition_count - 1];
			float best_error_scale = exit_thresholds_for_pcount[partition_count - 1] * 1.85f;
			if (best_error > (best_error_in_prev * best_error_scale))
			{
				trace_add_data("skip", "tune_partition_early_out_limit_factor");
				goto END_OF_TESTS;
			}

			if (errorval < error_threshold)
			{
				trace_add_data("exit", "quality hit");
				goto END_OF_TESTS;
			}
		}

		// If using N partitions doesn't improve much over using N-1 partitions then skip trying N+1
		float best_error = best_errorvals_for_pcount[partition_count - 1];
		float best_error_scale = exit_thresholds_for_pcount[partition_count - 1];
		if (best_error > (best_error_in_prev * best_error_scale))
		{
			trace_add_data("skip", "tune_partition_early_out_limit_factor");
			goto END_OF_TESTS;
		}
	}

	trace_add_data("exit", "quality not hit");

END_OF_TESTS:
	// If we still have an error block then convert to something we can encode
	// TODO: Do something more sensible here, such as average color block
	if (scb.block_type == SYM_BTYPE_ERROR)
	{
#if defined(ASTCENC_DIAGNOSTICS)
		static bool printed_once = false;
		if (!printed_once)
		{
			printed_once = true;
			printf("WARN: At least one block failed to find a valid encoding.\n"
			       "      Try increasing compression quality settings.\n\n");
		}
#endif

		scb.block_type = SYM_BTYPE_CONST_U16;
		vfloat4 color_f32 = clamp(0.0f, 1.0f, blk.origin_texel) * 65535.0f;
		vint4 color_u16 = float_to_int_rtn(color_f32);
		store(color_u16, scb.constant_color);
	}

	// Compress to a physical block
	symbolic_to_physical(bsd, scb, pcb);
}